

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O1

vector<Class,_std::allocator<Class>_> * __thiscall
Population::crossover
          (vector<Class,_std::allocator<Class>_> *__return_storage_ptr__,Population *this,
          vector<Class,_std::allocator<Class>_> *classes1,
          vector<Class,_std::allocator<Class>_> *classes2)

{
  result_type_conflict1 rVar1;
  ulong uVar2;
  pointer pCVar3;
  mt19937 *this_00;
  ulong uVar4;
  long lVar5;
  uniform_int_distribution<int> int_distribution;
  uniform_int_distribution<int> local_110;
  undefined1 local_108 [72];
  undefined1 *local_c0;
  unsigned_long local_b0 [2];
  vector<Teacher,_std::allocator<Teacher>_> local_a0;
  undefined1 *local_78;
  unsigned_long local_68 [2];
  undefined1 *local_58;
  unsigned_long local_48 [3];
  
  (__return_storage_ptr__->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110._M_param._M_b =
       (int)((ulong)((long)(classes1->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(classes1->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 3) * 0x684bda13;
  local_110._M_param._M_a = 0;
  random_engine();
  this_00 = &random_engine::smt;
  rVar1 = std::uniform_int_distribution<int>::operator()
                    (&local_110,&random_engine::smt,&local_110._M_param);
  pCVar3 = (classes1->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((classes1->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pCVar3) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      if ((long)uVar4 < (long)rVar1) {
        crossover((Class *)local_108,(Population *)this_00,
                  (Class *)((long)&(pCVar3->group).id + lVar5),
                  (Class *)((long)&(((classes2->super__Vector_base<Class,_std::allocator<Class>_>).
                                     _M_impl.super__Vector_impl_data._M_start)->group).id + lVar5));
        this_00 = (mt19937 *)local_108;
        std::vector<Class,_std::allocator<Class>_>::emplace_back<Class>
                  (__return_storage_ptr__,(Class *)local_108);
      }
      else {
        crossover((Class *)local_108,(Population *)this_00,
                  (Class *)((long)&(((classes2->super__Vector_base<Class,_std::allocator<Class>_>).
                                     _M_impl.super__Vector_impl_data._M_start)->group).id + lVar5),
                  (Class *)((long)&(pCVar3->group).id + lVar5));
        this_00 = (mt19937 *)local_108;
        std::vector<Class,_std::allocator<Class>_>::emplace_back<Class>
                  (__return_storage_ptr__,(Class *)local_108);
      }
      if (local_58 != local_108 + 0xc0) {
        this_00 = (mt19937 *)(local_48[0] + 1);
        operator_delete(local_58,(ulong)this_00);
      }
      if (local_78 != local_108 + 0xa0) {
        this_00 = (mt19937 *)(local_68[0] + 1);
        operator_delete(local_78,(ulong)this_00);
      }
      std::vector<Teacher,_std::allocator<Teacher>_>::~vector
                ((vector<Teacher,_std::allocator<Teacher>_> *)(local_108 + 0x68));
      if (local_c0 != local_108 + 0x58) {
        this_00 = (mt19937 *)(local_b0[0] + 1);
        operator_delete(local_c0,(ulong)this_00);
      }
      std::vector<Subject,_std::allocator<Subject>_>::~vector
                ((vector<Subject,_std::allocator<Subject>_> *)(local_108 + 0x28));
      if ((undefined1 *)local_108._8_8_ != local_108 + 0x18) {
        this_00 = (mt19937 *)(local_108._24_8_ + 1);
        operator_delete((void *)local_108._8_8_,(ulong)this_00);
      }
      uVar4 = uVar4 + 1;
      pCVar3 = (classes1->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(classes1->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar3 >> 3) * -0x7b425ed097b425ed;
      lVar5 = lVar5 + 0xd8;
    } while (uVar4 <= uVar2 && uVar2 - uVar4 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Class> Population::crossover(const vector<Class>& classes1,
                                    const vector<Class>& classes2) const {
    vector<Class> classes;
    uniform_int_distribution<int> int_distribution(0, classes1.size());
    int border = int_distribution(random_engine());
    for (int i = 0; i < classes1.size(); ++i) {
        if (i < border) {
            classes.push_back(crossover(classes1[i], classes2[i]));
        } else {
            classes.push_back(crossover(classes2[i], classes1[i]));
        }
    }
    return classes;
}